

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O2

void __thiscall tt::LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  MutexLock *this_00;
  AppendFile *this_01;
  string local_48;
  
  std::__cxx11::string::string((string *)this,(string *)basename);
  this->m_flushEveryN = flushEveryN;
  this->m_count = 0;
  this_00 = (MutexLock *)operator_new(0x30);
  MutexLock::MutexLock(this_00);
  (this->m_mutex)._M_t.super___uniq_ptr_impl<tt::MutexLock,_std::default_delete<tt::MutexLock>_>.
  _M_t.super__Tuple_impl<0UL,_tt::MutexLock_*,_std::default_delete<tt::MutexLock>_>.
  super__Head_base<0UL,_tt::MutexLock_*,_false>._M_head_impl = this_00;
  (this->m_file)._M_t.
  super___uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>.
  _M_t.
  super__Tuple_impl<0UL,_tt::FileUtil::AppendFile_*,_std::default_delete<tt::FileUtil::AppendFile>_>
  .super__Head_base<0UL,_tt::FileUtil::AppendFile_*,_false>._M_head_impl = (AppendFile *)0x0;
  this_01 = (AppendFile *)operator_new(0x10008);
  std::__cxx11::string::string((string *)&local_48,(string *)basename);
  FileUtil::AppendFile::AppendFile(this_01,&local_48);
  std::__uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>::
  reset((__uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_> *
        )&this->m_file,this_01);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

tt::LogFile::LogFile(const std::string& basename, int flushEveryN)
	:m_basename(basename),
	m_flushEveryN(flushEveryN),
	m_count(0),
	m_mutex(new MutexLock){
	
	m_file.reset(new FileUtil::AppendFile(basename));	
}